

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase633::run(TestCase633 *this)

{
  bool bVar1;
  char *this_00;
  float fVar2;
  double dVar3;
  char local_496;
  char local_495;
  bool local_494;
  char local_493;
  char local_492;
  DebugExpression<char> local_491;
  undefined1 local_490 [4];
  bool _kj_shouldLog_19;
  DebugComparison<char,_char> _kjCondition_19;
  undefined1 local_468 [4];
  bool _kj_shouldLog_18;
  DebugComparison<char,_char> _kjCondition_18;
  bool _kj_shouldLog_17;
  DebugExpression<bool> _kjCondition_17;
  double dStack_440;
  bool _kj_shouldLog_16;
  DebugExpression<double> local_438;
  undefined1 local_430 [8];
  DebugComparison<double,_double_&> _kjCondition_16;
  double f;
  int local_3f8;
  bool local_3f1;
  unsigned_long uStack_3f0;
  bool _kj_shouldLog_15;
  int local_3e8;
  DebugExpression<int> local_3e4;
  undefined1 local_3e0 [8];
  DebugComparison<int,_unsigned_long> _kjCondition_15;
  unsigned_long_long local_3b0;
  bool local_3a1;
  long lStack_3a0;
  bool _kj_shouldLog_14;
  unsigned_long_long local_398;
  DebugExpression<unsigned_long_long> local_390;
  undefined1 local_388 [8];
  DebugComparison<unsigned_long_long,_long> _kjCondition_14;
  bool local_355;
  uint local_354;
  int iStack_350;
  bool _kj_shouldLog_13;
  DebugExpression<int> local_34c;
  undefined1 local_348 [8];
  DebugComparison<int,_unsigned_int> _kjCondition_13;
  bool local_31d;
  int local_31c;
  uint uStack_318;
  bool _kj_shouldLog_12;
  DebugExpression<unsigned_int> local_314;
  undefined1 local_310 [8];
  DebugComparison<unsigned_int,_int> _kjCondition_12;
  int local_2e8;
  bool local_2e3;
  unsigned_short local_2e2;
  int local_2e0;
  bool _kj_shouldLog_11;
  DebugExpression<int> DStack_2dc;
  undefined1 local_2d8 [8];
  DebugComparison<int,_unsigned_short> _kjCondition_11;
  int local_2b0;
  bool local_2ab;
  short local_2aa;
  int local_2a8;
  bool _kj_shouldLog_10;
  DebugExpression<int> DStack_2a4;
  undefined1 local_2a0 [8];
  DebugComparison<int,_short> _kjCondition_10;
  int local_278;
  bool local_272;
  uchar local_271;
  int local_270;
  bool _kj_shouldLog_9;
  DebugExpression<int> DStack_26c;
  undefined1 local_268 [8];
  DebugComparison<int,_unsigned_char> _kjCondition_9;
  int local_240;
  bool local_23a;
  char local_239;
  int local_238;
  bool _kj_shouldLog_8;
  DebugExpression<int> DStack_234;
  undefined1 local_230 [8];
  DebugComparison<int,_signed_char> _kjCondition_8;
  unsigned_long_long local_208;
  bool local_1f9;
  unsigned_long uStack_1f8;
  bool _kj_shouldLog_7;
  unsigned_long_long local_1f0;
  DebugExpression<unsigned_long_long> local_1e8;
  undefined1 local_1e0 [8];
  DebugComparison<unsigned_long_long,_unsigned_long> _kjCondition_7;
  longlong local_1b0;
  bool local_1a1;
  long lStack_1a0;
  bool _kj_shouldLog_6;
  longlong local_198;
  DebugExpression<long_long> local_190;
  undefined1 local_188 [8];
  DebugComparison<long_long,_long> _kjCondition_6;
  bool local_155;
  uint local_154;
  uint uStack_150;
  bool _kj_shouldLog_5;
  DebugExpression<unsigned_int> local_14c;
  undefined1 local_148 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_5;
  bool local_11d;
  int local_11c;
  int iStack_118;
  bool _kj_shouldLog_4;
  DebugExpression<int> local_114;
  undefined1 local_110 [8];
  DebugComparison<int,_int> _kjCondition_4;
  uint local_e8;
  bool local_e3;
  unsigned_short local_e2;
  uint local_e0;
  bool _kj_shouldLog_3;
  DebugExpression<unsigned_int> DStack_dc;
  undefined1 local_d8 [8];
  DebugComparison<unsigned_int,_unsigned_short> _kjCondition_3;
  int local_b0;
  bool local_ab;
  short local_aa;
  int local_a8;
  bool _kj_shouldLog_2;
  DebugExpression<int> DStack_a4;
  undefined1 local_a0 [8];
  DebugComparison<int,_short> _kjCondition_2;
  uint local_78;
  bool local_72;
  uchar local_71;
  uint local_70;
  bool _kj_shouldLog_1;
  DebugExpression<unsigned_int> DStack_6c;
  undefined1 local_68 [8];
  DebugComparison<unsigned_int,_unsigned_char> _kjCondition_1;
  int local_40;
  bool local_3a;
  char local_39;
  int local_38;
  bool _kj_shouldLog;
  DebugExpression<int> DStack_34;
  undefined1 local_30 [8];
  DebugComparison<int,_signed_char> _kjCondition;
  TestCase633 *this_local;
  
  local_38 = 0x7f;
  _kjCondition._24_8_ = this;
  DStack_34 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_38);
  local_39 = MaxValue_::operator_cast_to_signed_char((MaxValue_ *)&maxValue);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_signed_char> *)local_30,&stack0xffffffffffffffcc,&local_39);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_30);
  if (!bVar1) {
    local_3a = kj::_::Debug::shouldLog(ERROR);
    while (local_3a != false) {
      local_40 = 0x7f;
      _kjCondition_1._31_1_ = MaxValue_::operator_cast_to_signed_char((MaxValue_ *)&maxValue);
      kj::_::Debug::log<char_const(&)[46],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x27a,ERROR,
                 "\"failed: expected \" \"(0x7f) == (int8_t(maxValue))\", _kjCondition, 0x7f, int8_t(maxValue)"
                 ,(char (*) [46])"failed: expected (0x7f) == (int8_t(maxValue))",
                 (DebugComparison<int,_signed_char> *)local_30,&local_40,&_kjCondition_1.field_0x1f)
      ;
      local_3a = false;
    }
  }
  local_70 = 0xff;
  DStack_6c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_70);
  local_71 = MaxValue_::operator_cast_to_unsigned_char((MaxValue_ *)&maxValue);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_char> *)local_68,&stack0xffffffffffffff94,
             &local_71);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_68);
  if (!bVar1) {
    local_72 = kj::_::Debug::shouldLog(ERROR);
    while (local_72 != false) {
      local_78 = 0xff;
      _kjCondition_2._31_1_ = MaxValue_::operator_cast_to_unsigned_char((MaxValue_ *)&maxValue);
      kj::_::Debug::
      log<char_const(&)[48],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x27b,ERROR,
                 "\"failed: expected \" \"(0xffu) == (uint8_t(maxValue))\", _kjCondition, 0xffu, uint8_t(maxValue)"
                 ,(char (*) [48])"failed: expected (0xffu) == (uint8_t(maxValue))",
                 (DebugComparison<unsigned_int,_unsigned_char> *)local_68,&local_78,
                 &_kjCondition_2.field_0x1f);
      local_72 = false;
    }
  }
  local_a8 = 0x7fff;
  DStack_a4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_a8);
  local_aa = MaxValue_::operator_cast_to_short((MaxValue_ *)&maxValue);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_short> *)local_a0,&stack0xffffffffffffff5c,&local_aa);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a0);
  if (!bVar1) {
    local_ab = kj::_::Debug::shouldLog(ERROR);
    while (local_ab != false) {
      local_b0 = 0x7fff;
      _kjCondition_3._30_2_ = MaxValue_::operator_cast_to_short((MaxValue_ *)&maxValue);
      kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<int,short>&,int,short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x27c,ERROR,
                 "\"failed: expected \" \"(0x7fff) == (int16_t(maxValue))\", _kjCondition, 0x7fff, int16_t(maxValue)"
                 ,(char (*) [49])"failed: expected (0x7fff) == (int16_t(maxValue))",
                 (DebugComparison<int,_short> *)local_a0,&local_b0,
                 (short *)&_kjCondition_3.field_0x1e);
      local_ab = false;
    }
  }
  local_e0 = 0xffff;
  DStack_dc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_e0);
  local_e2 = MaxValue_::operator_cast_to_unsigned_short((MaxValue_ *)&maxValue);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_short> *)local_d8,&stack0xffffffffffffff24,
             &local_e2);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d8);
  if (!bVar1) {
    local_e3 = kj::_::Debug::shouldLog(ERROR);
    while (local_e3 != false) {
      local_e8 = 0xffff;
      _kjCondition_4._30_2_ = MaxValue_::operator_cast_to_unsigned_short((MaxValue_ *)&maxValue);
      kj::_::Debug::
      log<char_const(&)[51],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x27d,ERROR,
                 "\"failed: expected \" \"(0xffffu) == (uint16_t(maxValue))\", _kjCondition, 0xffffu, uint16_t(maxValue)"
                 ,(char (*) [51])"failed: expected (0xffffu) == (uint16_t(maxValue))",
                 (DebugComparison<unsigned_int,_unsigned_short> *)local_d8,&local_e8,
                 (unsigned_short *)&_kjCondition_4.field_0x1e);
      local_e3 = false;
    }
  }
  iStack_118 = 0x7fffffff;
  local_114 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffee8);
  local_11c = MaxValue_::operator_cast_to_int((MaxValue_ *)&maxValue);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_110,&local_114,&local_11c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_110);
  if (!bVar1) {
    local_11d = kj::_::Debug::shouldLog(ERROR);
    while (local_11d != false) {
      _kjCondition_5._28_4_ = 0x7fffffff;
      _kjCondition_5._24_4_ = MaxValue_::operator_cast_to_int((MaxValue_ *)&maxValue);
      kj::_::Debug::log<char_const(&)[53],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x27e,ERROR,
                 "\"failed: expected \" \"(0x7fffffff) == (int32_t(maxValue))\", _kjCondition, 0x7fffffff, int32_t(maxValue)"
                 ,(char (*) [53])"failed: expected (0x7fffffff) == (int32_t(maxValue))",
                 (DebugComparison<int,_int> *)local_110,(int *)&_kjCondition_5.field_0x1c,
                 (int *)&_kjCondition_5.result);
      local_11d = false;
    }
  }
  uStack_150 = 0xffffffff;
  local_14c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffeb0);
  local_154 = MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&maxValue);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int> *)local_148,&local_14c,&local_154);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_148);
  if (!bVar1) {
    local_155 = kj::_::Debug::shouldLog(ERROR);
    while (local_155 != false) {
      _kjCondition_6._36_4_ = 0xffffffff;
      _kjCondition_6._32_4_ = MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&maxValue);
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x27f,ERROR,
                 "\"failed: expected \" \"(0xffffffffu) == (uint32_t(maxValue))\", _kjCondition, 0xffffffffu, uint32_t(maxValue)"
                 ,(char (*) [55])"failed: expected (0xffffffffu) == (uint32_t(maxValue))",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_148,
                 (uint *)&_kjCondition_6.field_0x24,(uint *)&_kjCondition_6.result);
      local_155 = false;
    }
  }
  local_198 = 0x7fffffffffffffff;
  local_190 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_198);
  lStack_1a0 = MaxValue_::operator_cast_to_long((MaxValue_ *)&maxValue);
  kj::_::DebugExpression<long_long>::operator==
            ((DebugComparison<long_long,_long> *)local_188,&local_190,&stack0xfffffffffffffe60);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_188);
  if (!bVar1) {
    local_1a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1a1 != false) {
      local_1b0 = 0x7fffffffffffffff;
      _kjCondition_7._32_8_ = MaxValue_::operator_cast_to_long((MaxValue_ *)&maxValue);
      kj::_::Debug::log<char_const(&)[63],kj::_::DebugComparison<long_long,long>&,long_long,long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x280,ERROR,
                 "\"failed: expected \" \"(0x7fffffffffffffffll) == (int64_t(maxValue))\", _kjCondition, 0x7fffffffffffffffll, int64_t(maxValue)"
                 ,(char (*) [63])"failed: expected (0x7fffffffffffffffll) == (int64_t(maxValue))",
                 (DebugComparison<long_long,_long> *)local_188,&local_1b0,
                 (long *)&_kjCondition_7.result);
      local_1a1 = false;
    }
  }
  local_1f0 = 0xffffffffffffffff;
  local_1e8 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1f0);
  uStack_1f8 = MaxValue_::operator_cast_to_unsigned_long((MaxValue_ *)&maxValue);
  kj::_::DebugExpression<unsigned_long_long>::operator==
            ((DebugComparison<unsigned_long_long,_unsigned_long> *)local_1e0,&local_1e8,
             &stack0xfffffffffffffe08);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1e0);
  if (!bVar1) {
    local_1f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1f9 != false) {
      local_208 = 0xffffffffffffffff;
      _kjCondition_8._24_8_ = MaxValue_::operator_cast_to_unsigned_long((MaxValue_ *)&maxValue);
      kj::_::Debug::
      log<char_const(&)[65],kj::_::DebugComparison<unsigned_long_long,unsigned_long>&,unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x281,ERROR,
                 "\"failed: expected \" \"(0xffffffffffffffffull) == (uint64_t(maxValue))\", _kjCondition, 0xffffffffffffffffull, uint64_t(maxValue)"
                 ,(char (*) [65])"failed: expected (0xffffffffffffffffull) == (uint64_t(maxValue))",
                 (DebugComparison<unsigned_long_long,_unsigned_long> *)local_1e0,&local_208,
                 (unsigned_long *)&_kjCondition_8.result);
      local_1f9 = false;
    }
  }
  local_238 = -0x80;
  DStack_234 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_238);
  local_239 = MinValue_::operator_cast_to_signed_char((MinValue_ *)&minValue);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_signed_char> *)local_230,&stack0xfffffffffffffdcc,&local_239);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_230);
  if (!bVar1) {
    local_23a = kj::_::Debug::shouldLog(ERROR);
    while (local_23a != false) {
      local_240 = -0x80;
      _kjCondition_9._31_1_ = MinValue_::operator_cast_to_signed_char((MinValue_ *)&minValue);
      kj::_::Debug::log<char_const(&)[47],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x283,ERROR,
                 "\"failed: expected \" \"(-0x80) == (int8_t(minValue))\", _kjCondition, -0x80, int8_t(minValue)"
                 ,(char (*) [47])"failed: expected (-0x80) == (int8_t(minValue))",
                 (DebugComparison<int,_signed_char> *)local_230,&local_240,
                 &_kjCondition_9.field_0x1f);
      local_23a = false;
    }
  }
  local_270 = 0;
  DStack_26c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_270);
  local_271 = MinValue_::operator_cast_to_unsigned_char((MinValue_ *)&minValue);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_char> *)local_268,&stack0xfffffffffffffd94,&local_271);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_268);
  if (!bVar1) {
    local_272 = kj::_::Debug::shouldLog(ERROR);
    while (local_272 != false) {
      local_278 = 0;
      _kjCondition_10._31_1_ = MinValue_::operator_cast_to_unsigned_char((MinValue_ *)&minValue);
      kj::_::Debug::
      log<char_const(&)[44],kj::_::DebugComparison<int,unsigned_char>&,int,unsigned_char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x284,ERROR,
                 "\"failed: expected \" \"(0) == (uint8_t(minValue))\", _kjCondition, 0, uint8_t(minValue)"
                 ,(char (*) [44])"failed: expected (0) == (uint8_t(minValue))",
                 (DebugComparison<int,_unsigned_char> *)local_268,&local_278,
                 &_kjCondition_10.field_0x1f);
      local_272 = false;
    }
  }
  local_2a8 = -0x8000;
  DStack_2a4 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2a8);
  local_2aa = MinValue_::operator_cast_to_short((MinValue_ *)&minValue);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_short> *)local_2a0,&stack0xfffffffffffffd5c,&local_2aa);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2a0);
  if (!bVar1) {
    local_2ab = kj::_::Debug::shouldLog(ERROR);
    while (local_2ab != false) {
      local_2b0 = -0x8000;
      _kjCondition_11._30_2_ = MinValue_::operator_cast_to_short((MinValue_ *)&minValue);
      kj::_::Debug::log<char_const(&)[50],kj::_::DebugComparison<int,short>&,int,short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x285,ERROR,
                 "\"failed: expected \" \"(-0x8000) == (int16_t(minValue))\", _kjCondition, -0x8000, int16_t(minValue)"
                 ,(char (*) [50])"failed: expected (-0x8000) == (int16_t(minValue))",
                 (DebugComparison<int,_short> *)local_2a0,&local_2b0,
                 (short *)&_kjCondition_11.field_0x1e);
      local_2ab = false;
    }
  }
  local_2e0 = 0;
  DStack_2dc = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2e0);
  local_2e2 = MinValue_::operator_cast_to_unsigned_short((MinValue_ *)&minValue);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_short> *)local_2d8,&stack0xfffffffffffffd24,&local_2e2);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2d8);
  if (!bVar1) {
    local_2e3 = kj::_::Debug::shouldLog(ERROR);
    while (local_2e3 != false) {
      local_2e8 = 0;
      _kjCondition_12._30_2_ = MinValue_::operator_cast_to_unsigned_short((MinValue_ *)&minValue);
      kj::_::Debug::
      log<char_const(&)[45],kj::_::DebugComparison<int,unsigned_short>&,int,unsigned_short>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x286,ERROR,
                 "\"failed: expected \" \"(0) == (uint16_t(minValue))\", _kjCondition, 0, uint16_t(minValue)"
                 ,(char (*) [45])"failed: expected (0) == (uint16_t(minValue))",
                 (DebugComparison<int,_unsigned_short> *)local_2d8,&local_2e8,
                 (unsigned_short *)&_kjCondition_12.field_0x1e);
      local_2e3 = false;
    }
  }
  uStack_318 = 0x80000000;
  local_314 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffce8);
  local_31c = MinValue_::operator_cast_to_int((MinValue_ *)&minValue);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_int> *)local_310,&local_314,&local_31c);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_310);
  if (!bVar1) {
    local_31d = kj::_::Debug::shouldLog(ERROR);
    while (local_31d != false) {
      _kjCondition_13._28_4_ = 0x80000000;
      _kjCondition_13._24_4_ = MinValue_::operator_cast_to_int((MinValue_ *)&minValue);
      kj::_::Debug::
      log<char_const(&)[54],kj::_::DebugComparison<unsigned_int,int>&,unsigned_int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x287,ERROR,
                 "\"failed: expected \" \"(-0x80000000) == (int32_t(minValue))\", _kjCondition, -0x80000000, int32_t(minValue)"
                 ,(char (*) [54])"failed: expected (-0x80000000) == (int32_t(minValue))",
                 (DebugComparison<unsigned_int,_int> *)local_310,(uint *)&_kjCondition_13.field_0x1c
                 ,(int *)&_kjCondition_13.result);
      local_31d = false;
    }
  }
  iStack_350 = 0;
  local_34c = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffcb0);
  local_354 = MinValue_::operator_cast_to_unsigned_int((MinValue_ *)&minValue);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_int> *)local_348,&local_34c,&local_354);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_348);
  if (!bVar1) {
    local_355 = kj::_::Debug::shouldLog(ERROR);
    while (local_355 != false) {
      _kjCondition_14._36_4_ = 0;
      _kjCondition_14._32_4_ = MinValue_::operator_cast_to_unsigned_int((MinValue_ *)&minValue);
      kj::_::Debug::
      log<char_const(&)[45],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x288,ERROR,
                 "\"failed: expected \" \"(0) == (uint32_t(minValue))\", _kjCondition, 0, uint32_t(minValue)"
                 ,(char (*) [45])"failed: expected (0) == (uint32_t(minValue))",
                 (DebugComparison<int,_unsigned_int> *)local_348,(int *)&_kjCondition_14.field_0x24,
                 (uint *)&_kjCondition_14.result);
      local_355 = false;
    }
  }
  local_398 = 0x8000000000000000;
  local_390 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_398);
  lStack_3a0 = MinValue_::operator_cast_to_long((MinValue_ *)&minValue);
  kj::_::DebugExpression<unsigned_long_long>::operator==
            ((DebugComparison<unsigned_long_long,_long> *)local_388,&local_390,
             &stack0xfffffffffffffc60);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_388);
  if (!bVar1) {
    local_3a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_3a1 != false) {
      local_3b0 = 0x8000000000000000;
      _kjCondition_15._32_8_ = MinValue_::operator_cast_to_long((MinValue_ *)&minValue);
      kj::_::Debug::
      log<char_const(&)[64],kj::_::DebugComparison<unsigned_long_long,long>&,unsigned_long_long,long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x289,ERROR,
                 "\"failed: expected \" \"(-0x8000000000000000ll) == (int64_t(minValue))\", _kjCondition, -0x8000000000000000ll, int64_t(minValue)"
                 ,(char (*) [64])"failed: expected (-0x8000000000000000ll) == (int64_t(minValue))",
                 (DebugComparison<unsigned_long_long,_long> *)local_388,&local_3b0,
                 (long *)&_kjCondition_15.result);
      local_3a1 = false;
    }
  }
  local_3e8 = 0;
  local_3e4 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_3e8);
  uStack_3f0 = MinValue_::operator_cast_to_unsigned_long((MinValue_ *)&minValue);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_unsigned_long> *)local_3e0,&local_3e4,&stack0xfffffffffffffc10);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3e0);
  if (!bVar1) {
    local_3f1 = kj::_::Debug::shouldLog(ERROR);
    while (local_3f1 != false) {
      local_3f8 = 0;
      f = (double)MinValue_::operator_cast_to_unsigned_long((MinValue_ *)&minValue);
      kj::_::Debug::
      log<char_const(&)[45],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x28a,ERROR,
                 "\"failed: expected \" \"(0) == (uint64_t(minValue))\", _kjCondition, 0, uint64_t(minValue)"
                 ,(char (*) [45])"failed: expected (0) == (uint64_t(minValue))",
                 (DebugComparison<int,_unsigned_long> *)local_3e0,&local_3f8,(unsigned_long *)&f);
      local_3f1 = false;
    }
  }
  fVar2 = inf();
  _kjCondition_16._32_8_ = (BADTYPE)fVar2;
  dStack_440 = (double)_kjCondition_16._32_8_ * 2.0;
  local_438 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xfffffffffffffbc0);
  kj::_::DebugExpression<double>::operator==
            ((DebugComparison<double,_double_&> *)local_430,&local_438,
             (double *)&_kjCondition_16.result);
  this_00 = local_430;
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)this_00);
  if (!bVar1) {
    this_00 = (char *)0x2;
    _kjCondition_18._31_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_18._31_1_ != '\0') {
      this_00 = 
      "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
      ;
      kj::_::Debug::log<char_const(&)[28],kj::_::DebugComparison<double,double&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x28d,ERROR,"\"failed: expected \" \"f * 2 == f\", _kjCondition",
                 (char (*) [28])"failed: expected f * 2 == f",
                 (DebugComparison<double,_double_&> *)local_430);
      _kjCondition_18._31_1_ = 0;
    }
  }
  dVar3 = nan(this_00);
  _kjCondition_16._32_8_ = (BADTYPE)SUB84(dVar3,0);
  _kjCondition_18._29_1_ = 0;
  _kjCondition_18._30_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)&_kjCondition_18.field_0x1d);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)&_kjCondition_18.field_0x1e);
  if (!bVar1) {
    _kjCondition_18._28_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_18._28_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[27],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x290,ERROR,"\"failed: expected \" \"!(f == f)\", _kjCondition",
                 (char (*) [27])"failed: expected !(f == f)",
                 (DebugExpression<bool> *)&_kjCondition_18.field_0x1e);
      _kjCondition_18._28_1_ = 0;
    }
  }
  _kjCondition_19._30_1_ = MinValue_::operator_cast_to_char((MinValue_ *)&minValue);
  _kjCondition_19._31_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&_kjCondition_19.field_0x1e);
  _kjCondition_19._29_1_ = 0;
  kj::_::DebugExpression<char>::operator<=
            ((DebugComparison<char,_char> *)local_468,
             (DebugExpression<char> *)&_kjCondition_19.field_0x1f,&_kjCondition_19.field_0x1d);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_468);
  if (!bVar1) {
    _kjCondition_19._28_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_19._28_1_ != '\0') {
      _kjCondition_19._27_1_ = MinValue_::operator_cast_to_char((MinValue_ *)&minValue);
      _kjCondition_19._26_1_ = 0;
      kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<char,char>&,char,char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x293,ERROR,
                 "\"failed: expected \" \"(char(minValue)) <= (\'\\\\0\')\", _kjCondition, char(minValue), \'\\0\'"
                 ,(char (*) [44])"failed: expected (char(minValue)) <= (\'\\0\')",
                 (DebugComparison<char,_char> *)local_468,&_kjCondition_19.field_0x1b,
                 &_kjCondition_19.field_0x1a);
      _kjCondition_19._28_1_ = 0;
    }
  }
  local_492 = MaxValue_::operator_cast_to_char((MaxValue_ *)&maxValue);
  local_491 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_492);
  local_493 = '\x7f';
  kj::_::DebugExpression<char>::operator>=
            ((DebugComparison<char,_char> *)local_490,&local_491,&local_493);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_490);
  if (!bVar1) {
    local_494 = kj::_::Debug::shouldLog(ERROR);
    while (local_494 != false) {
      local_495 = MaxValue_::operator_cast_to_char((MaxValue_ *)&maxValue);
      local_496 = '\x7f';
      kj::_::Debug::log<char_const(&)[46],kj::_::DebugComparison<char,char>&,char,char>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/common-test.c++"
                 ,0x294,ERROR,
                 "\"failed: expected \" \"(char(maxValue)) >= (\'\\\\x7f\')\", _kjCondition, char(maxValue), \'\\x7f\'"
                 ,(char (*) [46])"failed: expected (char(maxValue)) >= (\'\\x7f\')",
                 (DebugComparison<char,_char> *)local_490,&local_495,&local_496);
      local_494 = false;
    }
  }
  return;
}

Assistant:

TEST(Common, MinMaxValue) {
  EXPECT_EQ(0x7f, int8_t(maxValue));
  EXPECT_EQ(0xffu, uint8_t(maxValue));
  EXPECT_EQ(0x7fff, int16_t(maxValue));
  EXPECT_EQ(0xffffu, uint16_t(maxValue));
  EXPECT_EQ(0x7fffffff, int32_t(maxValue));
  EXPECT_EQ(0xffffffffu, uint32_t(maxValue));
  EXPECT_EQ(0x7fffffffffffffffll, int64_t(maxValue));
  EXPECT_EQ(0xffffffffffffffffull, uint64_t(maxValue));

  EXPECT_EQ(-0x80, int8_t(minValue));
  EXPECT_EQ(0, uint8_t(minValue));
  EXPECT_EQ(-0x8000, int16_t(minValue));
  EXPECT_EQ(0, uint16_t(minValue));
  EXPECT_EQ(-0x80000000, int32_t(minValue));
  EXPECT_EQ(0, uint32_t(minValue));
  EXPECT_EQ(-0x8000000000000000ll, int64_t(minValue));
  EXPECT_EQ(0, uint64_t(minValue));

  double f = inf();
  EXPECT_TRUE(f * 2 == f);

  f = nan();
  EXPECT_FALSE(f == f);

  // `char`'s signedness is platform-specific.
  EXPECT_LE(char(minValue), '\0');
  EXPECT_GE(char(maxValue), '\x7f');
}